

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

size_t utf8_char_copy(utf8_char_t *dst,utf8_char_t *src)

{
  size_t __n;
  
  __n = utf8_char_length(src);
  if (dst != (utf8_char_t *)0x0 && __n != 0) {
    memcpy(dst,src,__n);
    dst[__n] = '\0';
  }
  return __n;
}

Assistant:

size_t utf8_char_copy(utf8_char_t* dst, const utf8_char_t* src)
{
    size_t bytes = utf8_char_length(src);

    if (bytes && dst) {
        memcpy(dst, src, bytes);
        dst[bytes] = '\0';
    }

    return bytes;
}